

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_quaternion.cpp
# Opt level: O3

void __thiscall ON_Quaternion::SetRotation(ON_Quaternion *this,ON_Plane *plane0,ON_Plane *plane1)

{
  double dVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined4 uVar17;
  double *pdVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  bool bVar22;
  double dVar23;
  double dVar24;
  double local_78 [4];
  double local_58;
  double local_50;
  double dStack_48;
  double local_40;
  double dStack_38;
  
  dVar5 = (plane0->yaxis).x;
  dVar6 = (plane0->zaxis).x;
  dVar24 = (plane1->xaxis).x;
  dVar7 = (plane1->xaxis).y;
  dVar23 = (plane1->yaxis).x;
  dVar8 = (plane1->yaxis).y;
  dVar1 = (plane1->zaxis).x;
  dVar9 = (plane1->zaxis).y;
  dVar10 = (plane0->xaxis).x;
  dVar11 = (plane0->xaxis).y;
  dVar12 = (plane0->xaxis).z;
  local_78[0] = dVar1 * dVar6 + dVar24 * dVar10 + dVar23 * dVar5;
  local_58 = dVar9 * (plane0->zaxis).y + dVar7 * (plane0->xaxis).y + dVar8 * (plane0->yaxis).y;
  dVar13 = (plane0->yaxis).y;
  dVar14 = (plane0->yaxis).z;
  dVar15 = (plane0->zaxis).y;
  dVar16 = (plane0->zaxis).z;
  pdVar18 = local_78;
  local_78[1] = dVar1 * dVar15 + dVar24 * dVar11 + dVar23 * dVar13;
  local_78[2] = dVar1 * dVar16 + dVar24 * dVar12 + dVar23 * dVar14;
  local_78[3] = dVar9 * dVar6 + dVar7 * dVar10 + dVar8 * dVar5;
  dVar24 = (plane1->yaxis).z;
  dVar23 = (plane1->xaxis).z;
  dVar1 = (plane1->zaxis).z;
  local_50 = (plane0->zaxis).z * dVar9 + (plane0->xaxis).z * dVar7 + dVar8 * (plane0->yaxis).z;
  dStack_48 = dVar1 * dVar6 + dVar23 * dVar10 + dVar5 * dVar24;
  dStack_38 = dVar1 * dVar16 + dVar23 * dVar12 + dVar24 * dVar14;
  local_40 = dVar1 * dVar15 + dVar23 * dVar11 + dVar24 * dVar13;
  uVar19 = 0;
  do {
    uVar20 = 0;
    do {
      if (uVar19 == uVar20) {
        dVar24 = local_78[uVar19 * 4] + -1.0;
      }
      else {
        dVar24 = pdVar18[uVar20];
      }
      if (1.490116119385e-08 < ABS(dVar24)) {
        auVar2._8_8_ = -(ulong)(dStack_38 <= local_58);
        auVar2._0_8_ = -(ulong)(dStack_38 <= local_78[0]);
        uVar17 = movmskpd((int)pdVar18,auVar2);
        uVar3 = 2 - (byte)((byte)uVar17 >> 1);
        if (local_58 <= local_78[0]) {
          uVar3 = ((byte)~(byte)uVar17 & 1) * 2;
        }
        iVar4 = 0;
        if (uVar3 + 1 != 3) {
          iVar4 = uVar3 + 1;
        }
        uVar19 = (ulong)(uVar3 + ((uVar3 + 2) / 3) * -3 + 2);
        uVar20 = (ulong)uVar3;
        lVar21 = (long)iVar4;
        dVar24 = ((local_78[uVar20 * 4] + 1.0) - local_78[lVar21 * 4]) - local_78[uVar19 * 4];
        if (2.2250738585072014e-308 < dVar24) {
          if (dVar24 < 0.0) {
            dVar24 = sqrt(dVar24);
          }
          else {
            dVar24 = SQRT(dVar24);
          }
          dVar23 = 0.5 / dVar24;
          this->a = (local_78[uVar19 * 3 + lVar21] - local_78[lVar21 * 3 + uVar19]) * dVar23;
          (&this->b)[uVar20] = dVar24 * 0.5;
          (&this->b)[lVar21] =
               (local_78[uVar20 * 3 + lVar21] + local_78[lVar21 * 3 + uVar20]) * dVar23;
          (&this->b)[uVar19] =
               (local_78[uVar19 * 3 + uVar20] + local_78[uVar20 * 3 + uVar19]) * dVar23;
          return;
        }
        if (dVar24 < -1e-14) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_quaternion.cpp"
                     ,0xea,"","noisy rotation matrix");
        }
        goto LAB_00595ece;
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != 3);
    pdVar18 = pdVar18 + 3;
    bVar22 = 1 < uVar19;
    uVar19 = uVar19 + 1;
    if (bVar22) {
LAB_00595ece:
      this->a = 1.0;
      this->b = 0.0;
      this->c = 0.0;
      this->d = 0.0;
      return;
    }
  } while( true );
}

Assistant:

void ON_Quaternion::SetRotation(const ON_Plane& plane0, const ON_Plane& plane1 )
{
  double m[3][3], r, s;
  double* q;
  int i,j,k;

  // set m[][] = rotation matrix (acting on the left)
  m[0][0] = plane1.xaxis.x*plane0.xaxis.x
          + plane1.yaxis.x*plane0.yaxis.x
          + plane1.zaxis.x*plane0.zaxis.x;
  m[0][1] = plane1.xaxis.x*plane0.xaxis.y
          + plane1.yaxis.x*plane0.yaxis.y
          + plane1.zaxis.x*plane0.zaxis.y;
  m[0][2] = plane1.xaxis.x*plane0.xaxis.z
          + plane1.yaxis.x*plane0.yaxis.z
          + plane1.zaxis.x*plane0.zaxis.z;
  m[1][0] = plane1.xaxis.y*plane0.xaxis.x
          + plane1.yaxis.y*plane0.yaxis.x
          + plane1.zaxis.y*plane0.zaxis.x;
  m[1][1] = plane1.xaxis.y*plane0.xaxis.y
          + plane1.yaxis.y*plane0.yaxis.y
          + plane1.zaxis.y*plane0.zaxis.y;
  m[1][2] = plane1.xaxis.y*plane0.xaxis.z
          + plane1.yaxis.y*plane0.yaxis.z
          + plane1.zaxis.y*plane0.zaxis.z;
  m[2][0] = plane1.xaxis.z*plane0.xaxis.x
          + plane1.yaxis.z*plane0.yaxis.x
          + plane1.zaxis.z*plane0.zaxis.x;
  m[2][1] = plane1.xaxis.z*plane0.xaxis.y
          + plane1.yaxis.z*plane0.yaxis.y
          + plane1.zaxis.z*plane0.zaxis.y;
  m[2][2] = plane1.xaxis.z*plane0.xaxis.z
          + plane1.yaxis.z*plane0.yaxis.z
          + plane1.zaxis.z*plane0.zaxis.z;

  k = 1;
  s = ON_SQRT_EPSILON;
  for ( i = 0; i < 3 && k; i++ ) for ( j = 0; j < 3; j++ )
  {
    if ( i == j )
    {
      if (fabs(m[i][i]-1.0) > s )
      {
        k = 0;
        break;
      }
    }
    else
    {
      if (fabs(m[i][j]) > s )
      {
        k = 0;
        break;
      }
    }
  }

  if ( k )
  {
    // m[][] is the identity matrix
    a = 1.0;
    b = c = d = 0.0;
    return;
  }

  i = (m[0][0] >= m[1][1]) 
    ? ((m[0][0] >= m[2][2])?0:2) 
    : ((m[1][1] >= m[2][2])?1:2);
  j = (i+1)%3;
  k = (i+2)%3;

  // Note: 
  //   For any rotation matrix, the diagonal is
  //     x^2(1-cos(t)) + cos(t), y^2(1-cos(t)) + cos(t), z^2(1-cos(t)) + cos(t),
  //   where (x,y,z) is the unit vector axis of rotation and "t" is the angle.
  //   So the trace = 1 + 2cos(t).
  //
  //   When cos(t) >= 0, m[i][i] corresponds to the axis component that has
  //   the largest absolute value.
  //
  //   
  //
  //   Observe that 
  //     s = 1 + m[i][i] - m[j][j] - m[k][k]
  //       = 1 + 2*m[i][i] - m[i][i] - m[j][j] - m[k][k]
  //       = 1 + 2*m[i][i] - trace
  //       = 2*(m[i][i] - cos(t))
  //       = 2*(w^2(1-cos(t)^2) + cos(t) - cos(t))
  //       = 2*w*w*(sin(t)^2)
  //
  //    When cos(t) >= 0, m[i][i] corresponds to the coordinate of
  //    the rotation axis with largest absolute value.


  s = 1.0 + m[i][i] - m[j][j] - m[k][k];
  if ( s > ON_DBL_MIN )
  {
    r = sqrt(s);
    s = 0.5/r;
    a = s*(m[k][j] - m[j][k]);
    q = &b;
    q[i] = 0.5*r;
    q[j] = s*(m[i][j] + m[j][i]);
    q[k] = s*(m[k][i] + m[i][k]);
  }
  else
  {
    if ( s < -1.0e-14 )
      ON_ERROR("noisy rotation matrix");
    a = 1.0;
    b = c = d = 0.0;
  }
}